

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdcat.c
# Opt level: O2

void bsdcat_read_to_stdout(char *filename)

{
  wchar_t wVar1;
  int iVar2;
  
  wVar1 = archive_read_open_filename(a,filename,0x2800);
  if (wVar1 == L'\0') {
    iVar2 = archive_read_next_header(a,&ae);
    if (iVar2 == 0) {
      iVar2 = archive_read_data_into_fd(a,1);
      if (iVar2 == 0) goto LAB_00106625;
    }
  }
  bsdcat_print_error();
LAB_00106625:
  iVar2 = archive_read_free(a);
  if (iVar2 != 0) {
    bsdcat_print_error();
    return;
  }
  return;
}

Assistant:

void
bsdcat_read_to_stdout(char* filename)
{
	if ((archive_read_open_filename(a, filename, BYTES_PER_BLOCK) != ARCHIVE_OK)
	    || (archive_read_next_header(a, &ae) != ARCHIVE_OK)
	    || (archive_read_data_into_fd(a, 1) != ARCHIVE_OK))
		bsdcat_print_error();
	if (archive_read_free(a) != ARCHIVE_OK)
		bsdcat_print_error();
}